

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_set_bit(mbedtls_mpi *X,size_t pos,uchar val)

{
  ulong uVar1;
  size_t idx;
  size_t off;
  int ret;
  uchar val_local;
  size_t pos_local;
  mbedtls_mpi *X_local;
  
  off._0_4_ = 0;
  uVar1 = pos >> 6;
  if ((val != '\0') && (val != '\x01')) {
    return -4;
  }
  if ((ulong)X->n << 6 <= pos) {
    if (val == '\0') {
      return 0;
    }
    off._0_4_ = mbedtls_mpi_grow(X,uVar1 + 1);
    if ((int)off != 0) {
      return (int)off;
    }
  }
  X->p[uVar1] = (1L << ((byte)pos & 0x3f) ^ 0xffffffffffffffffU) & X->p[uVar1];
  X->p[uVar1] = (ulong)val << ((byte)pos & 0x3f) | X->p[uVar1];
  return (int)off;
}

Assistant:

int mbedtls_mpi_set_bit(mbedtls_mpi *X, size_t pos, unsigned char val)
{
    int ret = 0;
    size_t off = pos / biL;
    size_t idx = pos % biL;
    MPI_VALIDATE_RET(X != NULL);

    if (val != 0 && val != 1) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    if (X->n * biL <= pos) {
        if (val == 0) {
            return 0;
        }

        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, off + 1));
    }

    X->p[off] &= ~((mbedtls_mpi_uint) 0x01 << idx);
    X->p[off] |= (mbedtls_mpi_uint) val << idx;

cleanup:

    return ret;
}